

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.h
# Opt level: O3

longdouble * __thiscall
TPZMatrix<long_double>::operator()
          (longdouble *__return_storage_ptr__,TPZMatrix<long_double> *this,int64_t row,int64_t col)

{
  longdouble *plVar1;
  
  if ((((long)this < *(long *)((long)__return_storage_ptr__ + 8)) &&
      (-1 < (long)(row | (ulong)this))) && (row < *(long *)(__return_storage_ptr__ + 1))) {
    plVar1 = (longdouble *)
             (**(code **)(*(long *)__return_storage_ptr__ + 0x120))(__return_storage_ptr__,this,row)
    ;
    return plVar1;
  }
  Error("TPZMatrix<TVar>::Operator()","Index out of range");
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzmatrix.h",
             0x349);
}

Assistant:

inline TVar TPZMatrix<TVar>::operator()(const int64_t row, const int64_t col) const{
	// bound checking
#ifndef PZNODEBUG
	if ( (row >= Rows()) || (col >= Cols()) || row <0 || col<0 ) {
		Error("TPZMatrix<TVar>::Operator()","Index out of range");
        DebugStop();
	}
#endif
	return GetVal(row,col);
}